

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskContainer.cpp
# Opt level: O0

int __thiscall NodeFS::GetType(NodeFS *this)

{
  bool bVar1;
  int iVar2;
  reference ppNVar3;
  iterator iStack_28;
  int type_node;
  __normal_iterator<NodeFS_**,_std::vector<NodeFS_*,_std::allocator<NodeFS_*>_>_> local_20;
  iterator it;
  NodeFS *this_local;
  
  if (this->type_ == -1) {
    it._M_current = (NodeFS **)this;
    local_20._M_current =
         (NodeFS **)std::vector<NodeFS_*,_std::allocator<NodeFS_*>_>::begin(&this->sub_node_);
    while( true ) {
      iStack_28 = std::vector<NodeFS_*,_std::allocator<NodeFS_*>_>::end(&this->sub_node_);
      bVar1 = __gnu_cxx::operator!=(&local_20,&stack0xffffffffffffffd8);
      if (!bVar1) break;
      ppNVar3 = __gnu_cxx::
                __normal_iterator<NodeFS_**,_std::vector<NodeFS_*,_std::allocator<NodeFS_*>_>_>::
                operator*(&local_20);
      iVar2 = GetType(*ppNVar3);
      if (iVar2 != -1) {
        return iVar2;
      }
      __gnu_cxx::__normal_iterator<NodeFS_**,_std::vector<NodeFS_*,_std::allocator<NodeFS_*>_>_>::
      operator++(&local_20);
    }
    this_local._4_4_ = 0;
  }
  else {
    this_local._4_4_ = this->type_;
  }
  return this_local._4_4_;
}

Assistant:

int NodeFS::GetType()
{
   if (type_ != -1) return type_;
   for (std::vector<NodeFS*>::iterator it = sub_node_.begin(); it != sub_node_.end(); ++it)
   {
      int type_node = (*it)->GetType();
      if (type_node != -1)
         return type_node;
   }
   return 0;
}